

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

uint objgetap(mcmcxdef *ctx,objnum obj,prpnum prop,objnum *ornp,int inh)

{
  prpnum pVar1;
  uint uVar2;
  uchar *puVar3;
  objnum *orn_00;
  bool bVar4;
  dattyp typ;
  objnum orn;
  int local_38;
  objnum local_32;
  
  orn_00 = &local_32;
  if (ornp != (objnum *)0x0) {
    orn_00 = ornp;
  }
  while( true ) {
    uVar2 = objgetap0(ctx,obj,prop,orn_00,inh,&local_38);
    if ((uVar2 == 0) || (local_38 != 0xf)) break;
    puVar3 = mcmlck(ctx,*orn_00);
    pVar1 = *(prpnum *)(puVar3 + (ulong)uVar2 + 6);
    mcmunlck(ctx,*orn_00);
    bVar4 = pVar1 == prop;
    prop = pVar1;
    if (bVar4) {
      errsigf(ctx->mcmcxgl->mcmcxerr,"TADS",0x413);
    }
  }
  return uVar2;
}

Assistant:

uint objgetap(mcmcxdef *ctx, noreg objnum obj, prpnum prop,
              objnum *ornp, int inh)
{
    uint    retval;
    dattyp  typ;
    objnum  orn;

    /* 
     *   even if the caller doesn't care about the original object number,
     *   we do, so provide our own location to store it if necessary 
     */
    if (ornp == 0)
        ornp = &orn;

    /* keep going until we've finished translating synonyms */
    for (;;)
    {
        /* look up the property */
        retval = objgetap0(ctx, obj, prop, ornp, inh, &typ);
        
        /* 
         *   If we found something (i.e., retval != 0), check to see if we
         *   have a synonym; if so, synonym translation is required 
         */
        if (retval != 0 && typ == DAT_SYN)
        {
            prpnum  prvprop;
            objdef *objptr;
            prpdef *p;

            /* 
             *   Translation is required - get new property and try again.
             *   First, remember the original property, so we can make
             *   sure we're not going to loop (at least, not in this one
             *   synonym definition).  
             */
            prvprop = prop;

            objptr = (objdef *)mcmlck(ctx, (mcmon)*ornp);
            p = objofsp(objptr, retval);
            prop = osrp2(prpvalp(p));
            mcmunlck(ctx, (mcmon)*ornp);

            /* check for direct circularity */
            if (prop == prvprop)
                errsig(ctx->mcmcxgl->mcmcxerr, ERR_CIRCSYN);

            /* go back for another try with the new property */
            continue;
        }

        /* we don't have to perform a translation; return the result */
        return retval;
    }
}